

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O1

cl_command_queue xmrig::OclLib::createCommandQueue(cl_context context,cl_device_id device)

{
  undefined8 in_RAX;
  cl_command_queue p_Var1;
  runtime_error *this;
  char *pcVar2;
  cl_int ret;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  p_Var1 = createCommandQueue(context,device,&local_14);
  if (local_14 == 0) {
    return p_Var1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar2 = OclError::toString(local_14);
  std::runtime_error::runtime_error(this,pcVar2);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

cl_command_queue xmrig::OclLib::createCommandQueue(cl_context context, cl_device_id device)
{
    cl_int ret;
    cl_command_queue queue = createCommandQueue(context, device, &ret);
    if (ret != CL_SUCCESS) {
        throw std::runtime_error(OclError::toString(ret));
    }

    return queue;
}